

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Morse.cpp
# Opt level: O1

void __thiscall OpenMD::Morse::calcForce(Morse *this,InteractionData *idat)

{
  int iVar1;
  pointer piVar2;
  uint i;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Vector<double,_3U> result;
  Vector<double,_3U> result_1;
  double local_68 [4];
  double local_48 [4];
  double local_28;
  undefined8 uStack_20;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar2 = (this->Mtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[piVar2[idat->atid1]].
                    super__Vector_base<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar4 = (long)piVar2[idat->atid2] * 0x20;
  dVar12 = *(double *)(lVar3 + lVar4);
  dVar8 = *(double *)(lVar3 + 8 + lVar4);
  dVar11 = *(double *)(lVar3 + 0x10 + lVar4);
  iVar1 = *(int *)(lVar3 + 0x18 + lVar4);
  local_28 = -dVar11;
  uStack_20 = 0x8000000000000000;
  dVar5 = exp((idat->rij - dVar8) * local_28);
  if (idat->shiftedPot == false) {
    dVar6 = 0.0;
    dVar10 = 0.0;
    if (idat->shiftedForce == true) goto LAB_00257b55;
  }
  else {
LAB_00257b55:
    dVar6 = exp((idat->rcut - dVar8) * local_28);
    dVar10 = dVar6 * dVar6;
  }
  dVar7 = dVar5 * dVar5;
  dVar8 = 0.0;
  if (iVar1 == 1) {
    dVar9 = dVar12 * dVar7;
    dVar11 = dVar12 * -2.0 * dVar11;
    dVar7 = dVar7 * dVar11;
    if (idat->shiftedPot != true) {
      if (idat->shiftedForce == true) {
        dVar8 = dVar11 * dVar10;
        dVar12 = dVar12 * dVar10 + (idat->rij - idat->rcut) * dVar8;
        goto LAB_00257c73;
      }
LAB_00257c6f:
      dVar12 = 0.0;
      goto LAB_00257c73;
    }
  }
  else {
    if (iVar1 != 0) {
      dVar7 = 0.0;
      dVar12 = 0.0;
      dVar9 = 0.0;
      goto LAB_00257c73;
    }
    dVar9 = (dVar7 - (dVar5 + dVar5)) * dVar12;
    dVar11 = (dVar12 + dVar12) * dVar11;
    dVar7 = (dVar5 - dVar7) * dVar11;
    if (idat->shiftedPot != true) {
      if (idat->shiftedForce == true) {
        dVar8 = dVar11 * (dVar6 - dVar10);
        dVar12 = dVar12 * (dVar10 - (dVar6 + dVar6)) + (idat->rij - idat->rcut) * dVar8;
        goto LAB_00257c73;
      }
      goto LAB_00257c6f;
    }
    dVar10 = dVar10 - (dVar6 + dVar6);
  }
  dVar12 = dVar12 * dVar10;
LAB_00257c73:
  dVar11 = idat->sw;
  dVar5 = idat->vdwMult;
  dVar12 = (dVar9 - dVar12) * dVar5;
  dVar6 = dVar11 * dVar12;
  idat->vpair = dVar12 + idat->vpair;
  (idat->pot).data_[1] = (idat->pot).data_[1] + dVar6;
  if (idat->isSelected == true) {
    (idat->selePot).data_[1] = dVar6 + (idat->selePot).data_[1];
  }
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  lVar3 = 0;
  do {
    local_68[lVar3] =
         (idat->d).super_Vector<double,_3U>.data_[lVar3] * (dVar7 - dVar8) * dVar5 * dVar11;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  dVar12 = idat->rij;
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  lVar3 = 0;
  do {
    local_48[lVar3] = local_68[lVar3] / dVar12;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  lVar3 = 0;
  do {
    (idat->f1).super_Vector<double,_3U>.data_[lVar3] =
         local_48[lVar3] + (idat->f1).super_Vector<double,_3U>.data_[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  return;
}

Assistant:

void Morse::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    MorseInteractionData& mixer =
        MixingMap[Mtids[idat.atid1]][Mtids[idat.atid2]];

    RealType myPot    = 0.0;
    RealType myPotC   = 0.0;
    RealType myDeriv  = 0.0;
    RealType myDerivC = 0.0;

    RealType De       = mixer.De;
    RealType Re       = mixer.Re;
    RealType beta     = mixer.beta;
    MorseType variant = mixer.variant;

    // V(r) = D_e exp(-a(r-re)(exp(-a(r-re))-2)

    RealType expt    = -beta * (idat.rij - Re);
    RealType expfnc  = exp(expt);
    RealType expfnc2 = expfnc * expfnc;

    RealType exptC    = 0.0;
    RealType expfncC  = 0.0;
    RealType expfnc2C = 0.0;

    if (idat.shiftedPot || idat.shiftedForce) {
      exptC    = -beta * (idat.rcut - Re);
      expfncC  = exp(exptC);
      expfnc2C = expfncC * expfncC;
    }

    switch (variant) {
    case mtShifted: {
      myPot   = De * (expfnc2 - 2.0 * expfnc);
      myDeriv = 2.0 * De * beta * (expfnc - expfnc2);

      if (idat.shiftedPot) {
        myPotC   = De * (expfnc2C - 2.0 * expfncC);
        myDerivC = 0.0;
      } else if (idat.shiftedForce) {
        myPotC   = De * (expfnc2C - 2.0 * expfncC);
        myDerivC = 2.0 * De * beta * (expfncC - expfnc2C);
        myPotC += myDerivC * (idat.rij - idat.rcut);
      } else {
        myPotC   = 0.0;
        myDerivC = 0.0;
      }

      break;
    }
    case mtRepulsive: {
      myPot   = De * expfnc2;
      myDeriv = -2.0 * De * beta * expfnc2;

      if (idat.shiftedPot) {
        myPotC   = De * expfnc2C;
        myDerivC = 0.0;
      } else if (idat.shiftedForce) {
        myPotC   = De * expfnc2C;
        myDerivC = -2.0 * De * beta * expfnc2C;
        myPotC += myDerivC * (idat.rij - idat.rcut);
      } else {
        myPotC   = 0.0;
        myDerivC = 0.0;
      }

      break;
    }
    case mtUnknown: {
      // don't know what to do so don't do anything
      break;
    }
    }

    RealType pot_temp = idat.vdwMult * (myPot - myPotC);
    idat.vpair += pot_temp;

    RealType dudr = idat.sw * idat.vdwMult * (myDeriv - myDerivC);

    idat.pot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;
    if (idat.isSelected) idat.selePot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;

    idat.f1 += idat.d * dudr / idat.rij;

    return;
  }